

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O0

TimePoint kj::_::anon_unknown_39::now(void)

{
  int osErrorNumber;
  void *pvVar1;
  TimePoint TVar2;
  __syscall_slong_t extraout_RDX;
  timespec ts;
  Fault local_38;
  Fault f;
  SyscallResult local_24;
  undefined1 auStack_20 [4];
  SyscallResult _kjSyscallResult;
  timespec now;
  
  f.exception = (Exception *)auStack_20;
  local_24 = Debug::syscall<kj::_::(anonymous_namespace)::now()::__0>
                       ((anon_class_8_1_ba1d6636 *)&f,false);
  pvVar1 = Debug::SyscallResult::operator_cast_to_void_(&local_24);
  if (pvVar1 != (void *)0x0) {
    ts.tv_nsec = extraout_RDX;
    ts.tv_sec = now.tv_sec;
    TVar2 = toTimePoint(_auStack_20,ts);
    return (Quantity<long,_kj::_::NanosecondLabel>)TVar2.value.value;
  }
  osErrorNumber = Debug::SyscallResult::getErrorNumber(&local_24);
  Debug::Fault::Fault(&local_38,
                      "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
                      ,0x8c,osErrorNumber,"clock_gettime(CLOCK_MONOTONIC, &now)","");
  Debug::Fault::fatal(&local_38);
}

Assistant:

TimePoint now() {
  struct timespec now;
  KJ_SYSCALL(clock_gettime(CLOCK_MONOTONIC, &now));
  return toTimePoint(now);
}